

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# yabmpconvert.c
# Opt level: O2

void * custom_malloc(void *context,size_t size)

{
  void *pvVar1;
  void *pvVar2;
  
  allocation_current = allocation_current + 1;
  if (allocation_max < allocation_current) {
    return (void *)0x0;
  }
  pvVar1 = malloc(size + 0x10);
  pvVar2 = (void *)((long)pvVar1 + 0x10);
  if (pvVar1 == (void *)0x0) {
    pvVar2 = (void *)0x0;
  }
  return pvVar2;
}

Assistant:

static void* custom_malloc(void* context, size_t size)
{
	yabmp_uint8* buffer;
	(void)context;
	
	allocation_current++;
	if (allocation_current > allocation_max) {
		return NULL;
	}
	buffer = malloc(size+16);
	if (buffer != NULL) {
		buffer += 16;
	}
	return buffer;
}